

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<tcu::Matrix<float,_3,_3>_> __thiscall
vkt::shaderexecutor::exprP<tcu::Matrix<float,3,3>>
          (shaderexecutor *this,
          SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_> *ptr)

{
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Matrix<float,_3,_3>_> EVar1;
  SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_> *ptr_local;
  ExprP<tcu::Matrix<float,_3,_3>_> *ret;
  
  ExprP<tcu::Matrix<float,_3,_3>_>::ExprP((ExprP<tcu::Matrix<float,_3,_3>_> *)this);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>::operator=
            ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_> *)this,ptr);
  EVar1.super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>.m_state =
       extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>.m_ptr =
       (Expr<tcu::Matrix<float,_3,_3>_> *)this;
  return (ExprP<tcu::Matrix<float,_3,_3>_>)
         EVar1.super_ContainerExprPBase<tcu::Matrix<float,_3,_3>_>.
         super_ExprPBase<tcu::Matrix<float,_3,_3>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_3,_3>_>_>;
}

Assistant:

ExprP<T> exprP (const SharedPtr<const Expr<T> >& ptr)
{
	ExprP<T> ret;
	static_cast<SharedPtr<const Expr<T> >&>(ret) = ptr;
	return ret;
}